

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O3

String * __thiscall
Hpipe::Cond::ko_cpp(String *__return_storage_ptr__,Cond *this,String *var,Cond *not_in)

{
  pointer pcVar1;
  long lVar2;
  undefined1 auVar3 [16];
  String local_68;
  Cond local_48;
  
  local_48.p.super__Base_bitset<4UL>._M_w[2] = (this->p).super__Base_bitset<4UL>._M_w[2];
  local_48.p.super__Base_bitset<4UL>._M_w[3] = (this->p).super__Base_bitset<4UL>._M_w[3];
  local_48.p.super__Base_bitset<4UL>._M_w[0] = (this->p).super__Base_bitset<4UL>._M_w[0];
  local_48.p.super__Base_bitset<4UL>._M_w[1] = (this->p).super__Base_bitset<4UL>._M_w[1];
  lVar2 = 0;
  auVar3._8_4_ = 0xffffffff;
  auVar3._0_8_ = 0xffffffffffffffff;
  auVar3._12_4_ = 0xffffffff;
  do {
    *(undefined1 (*) [16])(local_48.p.super__Base_bitset<4UL>._M_w + lVar2) =
         *(undefined1 (*) [16])(local_48.p.super__Base_bitset<4UL>._M_w + lVar2) ^ auVar3;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  pcVar1 = (var->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + var->_M_string_length);
  ok_cpp(__return_storage_ptr__,&local_48,&local_68,not_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String Cond::ko_cpp( String var, const Cond *not_in ) const {
    Cond tmp = ~ *this;
    return tmp.ok_cpp( var, not_in );
}